

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O2

ChTriangleMeshConnected *
chrono::geometry::ChTriangleMeshConnected::Merge
          (ChTriangleMeshConnected *__return_storage_ptr__,
          vector<chrono::geometry::ChTriangleMeshConnected,_std::allocator<chrono::geometry::ChTriangleMeshConnected>_>
          *meshes)

{
  undefined1 auVar1 [64];
  long lVar2;
  long lVar3;
  ulong *puVar4;
  ulong *puVar5;
  int iVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  int local_c4;
  int local_c0;
  int local_bc;
  vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> tmp;
  ChVector<int> local_98;
  undefined1 local_88 [16];
  vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *local_78;
  vector<chrono::ChColor,std::allocator<chrono::ChColor>> *local_70;
  vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *local_68;
  vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>> *local_60;
  vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *local_58;
  vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *local_50;
  vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *local_48;
  vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *local_40;
  long local_38;
  
  auVar12 = ZEXT1664((undefined1  [16])0x0);
  local_40 = (vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)
             &__return_storage_ptr__->m_vertices;
  local_c4 = 0;
  local_c0 = 0;
  local_bc = 0;
  iVar6 = 0;
  local_50 = (vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)
             &__return_storage_ptr__->m_normals;
  local_70 = (vector<chrono::ChColor,std::allocator<chrono::ChColor>> *)
             &__return_storage_ptr__->m_colors;
  local_58 = (vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
             &__return_storage_ptr__->m_face_n_indices;
  local_78 = (vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
             &__return_storage_ptr__->m_face_col_indices;
  (__return_storage_ptr__->super_ChTriangleMesh).super_ChGeometry._vptr_ChGeometry =
       (_func_int **)&PTR__ChTriangleMeshConnected_0118aa20;
  auVar1 = vmovdqu64_avx512f(auVar12);
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->m_face_n_indices).
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar1;
  auVar1 = vmovdqu64_avx512f(auVar12);
  __return_storage_ptr__->m_vertices =
       (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)auVar1._0_24_;
  __return_storage_ptr__->m_normals =
       (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)auVar1._24_24_;
  (__return_storage_ptr__->m_UV).
  super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)auVar1._48_8_;
  (__return_storage_ptr__->m_UV).
  super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)auVar1._56_8_;
  auVar1 = vmovdqu64_avx512f(auVar12);
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->m_UV).
    super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = auVar1;
  auVar1 = vmovdqu64_avx512f(auVar12);
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->m_face_uv_indices).
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar1;
  (__return_storage_ptr__->m_filename)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_filename).field_2;
  local_60 = (vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>> *)
             &__return_storage_ptr__->m_UV;
  (__return_storage_ptr__->m_filename)._M_string_length = 0;
  (__return_storage_ptr__->m_filename).field_2._M_local_buf[0] = '\0';
  local_48 = (vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
             &__return_storage_ptr__->m_face_v_indices;
  local_68 = (vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
             &__return_storage_ptr__->m_face_uv_indices;
  local_38 = *(long *)(meshes + 8);
  for (lVar7 = *(long *)meshes; lVar7 != local_38; lVar7 = lVar7 + 0x100) {
    std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
    insert<__gnu_cxx::__normal_iterator<chrono::ChVector<double>*,std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>>,void>
              (local_40,(__return_storage_ptr__->m_vertices).
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,*(ChVector<double> **)(lVar7 + 8)
               ,*(ChVector<double> **)(lVar7 + 0x10));
    tmp.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tmp.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tmp.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::reserve
              (&tmp,(*(long *)(lVar7 + 0x70) - *(long *)(lVar7 + 0x68)) / 0xc);
    puVar4 = *(ulong **)(lVar7 + 0x68);
    puVar5 = *(ulong **)(lVar7 + 0x70);
    local_88 = vpbroadcastd_avx512vl();
    for (; puVar4 != puVar5; puVar4 = (ulong *)((long)puVar4 + 0xc)) {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *puVar4;
      auVar11 = vpaddd_avx(auVar8,local_88);
      local_98.m_data._0_8_ = auVar11._0_8_;
      local_98.m_data[2] = (int)puVar4[1] + iVar6;
      std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
      emplace_back<chrono::ChVector<int>>
                ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)&tmp,
                 &local_98);
    }
    std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
    insert<__gnu_cxx::__normal_iterator<chrono::ChVector<int>*,std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>>,void>
              (local_48,(__return_storage_ptr__->m_face_v_indices).
                        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<chrono::ChVector<int>_*,_std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>_>
                )tmp.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<chrono::ChVector<int>_*,_std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>_>
                )tmp.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    lVar2 = *(long *)(lVar7 + 0x10);
    lVar3 = *(long *)(lVar7 + 8);
    std::_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::~_Vector_base
              ((_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *)&tmp)
    ;
    std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
    insert<__gnu_cxx::__normal_iterator<chrono::ChVector<double>*,std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>>,void>
              (local_50,(__return_storage_ptr__->m_normals).
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
               *(ChVector<double> **)(lVar7 + 0x20),*(ChVector<double> **)(lVar7 + 0x28));
    tmp.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tmp.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tmp.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::reserve
              (&tmp,(*(long *)(lVar7 + 0x88) - *(long *)(lVar7 + 0x80)) / 0xc);
    iVar6 = iVar6 + (int)((lVar2 - lVar3) / 0x18);
    puVar4 = *(ulong **)(lVar7 + 0x80);
    puVar5 = *(ulong **)(lVar7 + 0x88);
    local_88 = vpbroadcastd_avx512vl();
    for (; puVar4 != puVar5; puVar4 = (ulong *)((long)puVar4 + 0xc)) {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *puVar4;
      auVar11 = vpaddd_avx(auVar9,local_88);
      local_98.m_data._0_8_ = auVar11._0_8_;
      local_98.m_data[2] = (int)puVar4[1] + local_bc;
      std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
      emplace_back<chrono::ChVector<int>>
                ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)&tmp,
                 &local_98);
    }
    std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
    insert<__gnu_cxx::__normal_iterator<chrono::ChVector<int>*,std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>>,void>
              (local_58,(__return_storage_ptr__->m_face_n_indices).
                        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<chrono::ChVector<int>_*,_std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>_>
                )tmp.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<chrono::ChVector<int>_*,_std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>_>
                )tmp.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    lVar2 = *(long *)(lVar7 + 0x28);
    lVar3 = *(long *)(lVar7 + 0x20);
    std::_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::~_Vector_base
              ((_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *)&tmp)
    ;
    std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>::
    insert<__gnu_cxx::__normal_iterator<chrono::ChVector2<double>*,std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>>,void>
              (local_60,(__return_storage_ptr__->m_UV).
                        super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
               *(ChVector2<double> **)(lVar7 + 0x38),*(ChVector2<double> **)(lVar7 + 0x40));
    tmp.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tmp.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tmp.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::reserve
              (&tmp,(*(long *)(lVar7 + 0xa0) - *(long *)(lVar7 + 0x98)) / 0xc);
    local_bc = local_bc + (int)((lVar2 - lVar3) / 0x18);
    puVar4 = *(ulong **)(lVar7 + 0x98);
    puVar5 = *(ulong **)(lVar7 + 0xa0);
    local_88 = vpbroadcastd_avx512vl();
    for (; puVar4 != puVar5; puVar4 = (ulong *)((long)puVar4 + 0xc)) {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = *puVar4;
      auVar11 = vpaddd_avx(auVar10,local_88);
      local_98.m_data._0_8_ = auVar11._0_8_;
      local_98.m_data[2] = (int)puVar4[1] + local_c0;
      std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
      emplace_back<chrono::ChVector<int>>
                ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)&tmp,
                 &local_98);
    }
    std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
    insert<__gnu_cxx::__normal_iterator<chrono::ChVector<int>*,std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>>,void>
              (local_68,(__return_storage_ptr__->m_face_uv_indices).
                        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<chrono::ChVector<int>_*,_std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>_>
                )tmp.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<chrono::ChVector<int>_*,_std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>_>
                )tmp.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    lVar2 = *(long *)(lVar7 + 0x40);
    lVar3 = *(long *)(lVar7 + 0x38);
    std::_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::~_Vector_base
              ((_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *)&tmp)
    ;
    std::vector<chrono::ChColor,std::allocator<chrono::ChColor>>::
    insert<__gnu_cxx::__normal_iterator<chrono::ChColor*,std::vector<chrono::ChColor,std::allocator<chrono::ChColor>>>,void>
              (local_70,(__return_storage_ptr__->m_colors).
                        super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>.
                        _M_impl.super__Vector_impl_data._M_finish,*(ChColor **)(lVar7 + 0x50),
               *(ChColor **)(lVar7 + 0x58));
    tmp.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tmp.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tmp.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::reserve
              (&tmp,(*(long *)(lVar7 + 0xb8) - *(long *)(lVar7 + 0xb0)) / 0xc);
    puVar4 = *(ulong **)(lVar7 + 0xb8);
    local_c0 = local_c0 + (int)((ulong)(lVar2 - lVar3) >> 4);
    puVar5 = *(ulong **)(lVar7 + 0xb0);
    local_88 = vpbroadcastd_avx512vl();
    for (; puVar5 != puVar4; puVar5 = (ulong *)((long)puVar5 + 0xc)) {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *puVar5;
      auVar11 = vpaddd_avx(auVar11,local_88);
      local_98.m_data._0_8_ = auVar11._0_8_;
      local_98.m_data[2] = (int)puVar5[1] + local_c4;
      std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
      emplace_back<chrono::ChVector<int>>
                ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)&tmp,
                 &local_98);
    }
    std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
    insert<__gnu_cxx::__normal_iterator<chrono::ChVector<int>*,std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>>,void>
              (local_78,(__return_storage_ptr__->m_face_col_indices).
                        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<chrono::ChVector<int>_*,_std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>_>
                )tmp.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<chrono::ChVector<int>_*,_std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>_>
                )tmp.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    local_c4 = local_c4 + (int)((*(long *)(lVar7 + 0x58) - *(long *)(lVar7 + 0x50)) / 0xc);
    std::_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::~_Vector_base
              ((_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *)&tmp)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

ChTriangleMeshConnected ChTriangleMeshConnected::Merge(std::vector<ChTriangleMeshConnected>& meshes) {
    ChTriangleMeshConnected trimesh;
    auto& vertices = trimesh.m_vertices;
    auto& normals = trimesh.m_normals;
    auto& uvs = trimesh.m_UV;
    auto& colors = trimesh.m_colors;
    auto& idx_vertices = trimesh.m_face_v_indices;
    auto& idx_normals = trimesh.m_face_n_indices;
    auto& idx_uvs = trimesh.m_face_uv_indices;
    auto& idx_colors = trimesh.m_face_col_indices;

    int v_off = 0;
    int n_off = 0;
    int uv_off = 0;
    int c_off = 0;
    for (auto& m : meshes) {
        {
            vertices.insert(vertices.end(), m.m_vertices.begin(), m.m_vertices.end());
            std::vector<ChVector<int>> tmp;
            tmp.reserve(m.m_face_v_indices.size());
            std::transform(m.m_face_v_indices.begin(), m.m_face_v_indices.end(), std::back_inserter(tmp),
                           [&v_off](ChVector<int>& a) { return a + v_off; });
            idx_vertices.insert(idx_vertices.end(), tmp.begin(), tmp.end());
            v_off += static_cast<int>(m.m_vertices.size());
        }

        {
            normals.insert(normals.end(), m.m_normals.begin(), m.m_normals.end());
            std::vector<ChVector<int>> tmp;
            tmp.reserve(m.m_face_n_indices.size());
            std::transform(m.m_face_n_indices.begin(), m.m_face_n_indices.end(), std::back_inserter(tmp),
                           [&n_off](ChVector<int>& a) { return a + n_off; });
            idx_normals.insert(idx_normals.end(), tmp.begin(), tmp.end());
            n_off += static_cast<int>(m.m_normals.size());
        }

        {
            uvs.insert(uvs.end(), m.m_UV.begin(), m.m_UV.end());
            std::vector<ChVector<int>> tmp;
            tmp.reserve(m.m_face_uv_indices.size());
            std::transform(m.m_face_uv_indices.begin(), m.m_face_uv_indices.end(), std::back_inserter(tmp),
                           [&uv_off](ChVector<int>& a) { return a + uv_off; });
            idx_uvs.insert(idx_uvs.end(), tmp.begin(), tmp.end());
            uv_off += static_cast<int>(m.m_UV.size());
        }

        {
            colors.insert(colors.end(), m.m_colors.begin(), m.m_colors.end());
            std::vector<ChVector<int>> tmp;
            tmp.reserve(m.m_face_col_indices.size());
            std::transform(m.m_face_col_indices.begin(), m.m_face_col_indices.end(), std::back_inserter(tmp),
                           [&c_off](ChVector<int>& a) { return a + c_off; });
            idx_colors.insert(idx_colors.end(), tmp.begin(), tmp.end());
            c_off += static_cast<int>(m.m_colors.size());
        }
    }

    return trimesh;
}